

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O3

void __thiscall clipp::parameter::parameter<>(parameter *this,arg_string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 uStack_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  arg_string local_78;
  predicate_adapter local_58;
  
  paVar1 = &(this->super_token<clipp::parameter>).doc_.field_2;
  (this->super_token<clipp::parameter>).doc_._M_dataplus._M_p = (pointer)paVar1;
  (this->super_token<clipp::parameter>).doc_._M_string_length = 0;
  (this->super_token<clipp::parameter>).doc_.field_2._M_local_buf[0] = '\0';
  (this->super_token<clipp::parameter>).repeatable_ = false;
  (this->super_token<clipp::parameter>).blocking_ = false;
  memset(&this->super_action_provider<clipp::parameter>,0,0x90);
  local_98 = 0;
  local_a0 = clipp::match::none;
  local_58.match_._M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_58.match_.super__Function_base._M_functor._M_unused._M_object = clipp::match::none;
  local_58.match_.super__Function_base._M_functor._8_8_ = 0;
  local_58.match_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  local_90 = (code *)0x0;
  uStack_88 = 0;
  local_80 = paVar1;
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>
            ((function<clipp::subrange(std::__cxx11::string_const&)> *)&this->matcher_,&local_58);
  if (local_58.match_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.match_.super__Function_base._M_manager)
              ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
    if (local_90 != (code *)0x0) {
      (*local_90)(&local_a0,&local_a0,3);
    }
  }
  (this->label_)._M_dataplus._M_p = (pointer)&(this->label_).field_2;
  (this->label_)._M_string_length = 0;
  (this->label_).field_2._M_local_buf[0] = '\0';
  this->required_ = false;
  this->greedy_ = false;
  local_78._M_dataplus._M_p = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == paVar1) {
    local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&str->field_2 + 8);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_78._M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  add_flags(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit
    parameter(arg_string str, Strings&&... strs):
        flags_{},
        matcher_{predicate_adapter{match::none}},
        label_{}, required_{false}, greedy_{false}
    {
        add_flags(std::move(str), std::forward<Strings>(strs)...);
    }